

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cc
# Opt level: O0

string * kratos::fields_to_json
                   (string *__return_storage_ptr__,
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
                   *vars)

{
  type *format_str;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  *this;
  bool bVar1;
  size_type __n;
  element_type *this_00;
  Var *var_00;
  char (*format_str_00) [4];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar2;
  format_args args;
  string_view sep;
  format_args args_00;
  string_view format_str_01;
  string_view format_str_02;
  basic_string_view<char> local_228;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_210;
  arg_join<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_char>
  local_208;
  undefined1 local_1e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> content;
  string local_1a8;
  __shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *local_188;
  type *var;
  type *name;
  _Self local_170;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entries;
  allocator<char> local_12a;
  byte local_129;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  *local_128;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  *vars_local;
  string *result;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_110;
  basic_string_view<char> local_108;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_d0;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  type *local_c0;
  char *local_b8;
  string *local_b0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_a8;
  basic_string_view<char> local_98;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_88;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_fmt::v7::arg_join<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_char>_>
  *vargs_1;
  char *local_68;
  undefined1 *local_60;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_58;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_48;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_40;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  local_129 = 0;
  local_128 = vars;
  vars_local = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
                *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"{",&local_12a);
  std::allocator<char>::~allocator(&local_12a);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1);
  __n = std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
        ::size(local_128);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1,__n);
  this = local_128;
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
           ::begin(local_128);
  local_170._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
       ::end(this);
  while( true ) {
    bVar1 = std::operator!=(&__end1,&local_170);
    if (!bVar1) break;
    name = &std::
            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>
            ::operator*(&__end1)->first;
    var = (type *)std::get<0ul,std::__cxx11::string_const,std::shared_ptr<kratos::Var>>
                            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>
                              *)name);
    local_188 = &std::get<1ul,std::__cxx11::string_const,std::shared_ptr<kratos::Var>>
                           ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>
                             *)name)->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>;
    format_str = var;
    this_00 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get(local_188);
    full_path_abi_cxx11_((string *)((long)&content.field_2 + 8),(kratos *)this_00,var_00);
    local_b0 = &local_1a8;
    local_b8 = "\"{0}\": \"{1}\"";
    local_c0 = format_str;
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&content.field_2 + 8);
    fmt::v7::make_args_checked<std::__cxx11::string_const&,std::__cxx11::string,char[13],char>
              (&local_f8,(v7 *)"\"{0}\": \"{1}\"",(char (*) [13])format_str,
               (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)vargs,
               (remove_reference_t<std::__cxx11::basic_string<char>_> *)in_R8.values_);
    local_d0 = &local_f8;
    bVar2 = fmt::v7::to_string_view<char,_0>(local_b8);
    local_50 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&result;
    local_58 = local_d0;
    local_48 = local_d0;
    local_38 = local_d0;
    local_40 = local_50;
    local_108 = bVar2;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_50,0xdd,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_d0);
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_110.values_;
    format_str_01.size_ = (size_t)result;
    format_str_01.data_ = (char *)local_108.size_;
    in_R8 = local_110;
    fmt::v7::detail::vformat_abi_cxx11_(&local_1a8,(detail *)local_108.data_,format_str_01,args);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&__range1,
               &local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)(content.field_2._M_local_buf + 8));
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>
    ::operator++(&__end1);
  }
  local_210 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range1);
  local_218._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&__range1);
  fmt::v7::basic_string_view<char>::basic_string_view(&local_228,", ");
  sep.size_ = (size_t)in_R9.values_;
  sep.data_ = (char *)local_228.size_;
  fmt::v7::
  join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (&local_208,(v7 *)local_210,local_218,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )local_228.data_,sep);
  local_60 = local_1e8;
  local_68 = "{0}";
  vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_fmt::v7::arg_join<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_char>_>
             *)&local_208;
  local_88.named_args.data =
       (named_arg_info<char> *)
       fmt::v7::
       make_args_checked<fmt::v7::arg_join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,char>,char[4],char>
                 ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_fmt::v7::arg_join<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_char>_>
                   *)0x457783,(v7 *)vargs_1,format_str_00,
                  (remove_reference_t<fmt::v7::arg_join<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char>_*,_std::vector<std::__cxx11::basic_string<char>_>_>,___gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char>_*,_std::vector<std::__cxx11::basic_string<char>_>_>,_char>_>
                   *)local_228.data_);
  local_78 = &local_88;
  local_98 = fmt::v7::to_string_view<char,_0>(local_68);
  local_28 = &local_a8;
  local_30 = local_78;
  local_20 = local_78;
  local_10 = local_78;
  local_18 = local_28;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_28,0xf,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)&local_78->string);
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_a8.field_1.values_;
  format_str_02.size_ = local_a8.desc_;
  format_str_02.data_ = (char *)local_98.size_;
  fmt::v7::detail::vformat_abi_cxx11_
            ((string *)local_1e8,(detail *)local_98.data_,format_str_02,args_00);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  local_129 = 1;
  std::__cxx11::string::~string((string *)local_1e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1);
  if ((local_129 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string fields_to_json(const std::map<std::string, std::shared_ptr<Var>> &vars) {
    // layman's json serializer
    std::string result = "{";
    std::vector<std::string> entries;
    entries.reserve(vars.size());
    for (auto const &[name, var] : vars) {
        entries.emplace_back(fmt::format(R"("{0}": "{1}")", name, full_path(var.get())));
    }
    auto content = fmt::format("{0}", fmt::join(entries.begin(), entries.end(), ", "));
    result.append(content);
    result.append("}");
    return result;
}